

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_setAllocator(PHYSFS_Allocator *a)

{
  PHYSFS_Allocator *a_local;
  
  if (initialized == 0) {
    externalAllocator = (int)(a != (PHYSFS_Allocator *)0x0);
    if (externalAllocator != 0) {
      memcpy(&__PHYSFS_AllocatorHooks,a,0x28);
    }
    a_local._4_4_ = 1;
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_IS_INITIALIZED);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int PHYSFS_setAllocator(const PHYSFS_Allocator *a)
{
    BAIL_IF(initialized, PHYSFS_ERR_IS_INITIALIZED, 0);
    externalAllocator = (a != NULL);
    if (externalAllocator)
        memcpy(&allocator, a, sizeof (PHYSFS_Allocator));

    return 1;
}